

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseExpr(WastParser *this,ExprList *exprs)

{
  Token *pTVar1;
  int *piVar2;
  Expr *pEVar3;
  long *plVar4;
  pointer pbVar5;
  bool bVar6;
  TokenType TVar7;
  Result RVar8;
  Result RVar9;
  ExprList *pEVar10;
  IfExceptExpr *pIVar11;
  undefined8 uVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  Token local_3c0;
  Token local_370;
  Token local_320;
  Token local_2d0;
  Token local_280;
  Token local_230;
  Token local_1e0;
  Token local_190;
  Token local_140;
  _Head_base<0UL,_wabt::Expr_*,_false> local_f0;
  _Head_base<0UL,_wabt::Expr_*,_false> local_e8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_e0;
  _Head_base<0UL,_wabt::Expr_*,_false> local_d8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_d0;
  undefined1 auStack_c8 [8];
  Location loc;
  size_type sStack_a0;
  size_type local_98;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  allocator_type local_39;
  IfExceptExpr *local_38;
  
  TVar7 = Peek(this,0);
  RVar9.enum_ = Error;
  if (TVar7 != Lpar) {
    return (Result)Error;
  }
  TVar7 = Peek(this,1);
  if ((0x33 < TVar7 - AtomicLoad) ||
     ((0xdfffffd33df7fU >> ((ulong)(TVar7 - AtomicLoad) & 0x3f) & 1) == 0)) {
    pTVar1 = (Token *)((long)&loc.field_1 + 8);
    GetToken(pTVar1,this);
    loc.filename.size_ = local_98;
    loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aStack_90.offset;
    auStack_c8 = (undefined1  [8])loc.field_1._8_8_;
    Token::~Token(pTVar1);
    TVar7 = Peek(this,1);
    if ((int)TVar7 < 0x40) {
      if (TVar7 != Block) {
        if (TVar7 != IfExcept) {
LAB_00f58b2d:
          __assert_fail("!\"ParseExpr should only be called when IsExpr() is true\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                        ,0x830,"Result wabt::WastParser::ParseExpr(ExprList *)");
        }
        Consume(&local_190,this);
        Token::~Token(&local_190);
        pTVar1 = (Token *)((long)&loc.field_1 + 8);
        Consume(pTVar1,this);
        ErrorUnlessOpcodeEnabled(this,pTVar1);
        Token::~Token((Token *)((long)&loc.field_1 + 8));
        MakeUnique<wabt::IfExceptExpr,wabt::Location&>((wabt *)&local_38,(Location *)auStack_c8);
        RVar8 = ParseIfExceptHeader(this,local_38);
        RVar9.enum_ = Error;
        if (RVar8.enum_ != Error) {
          bVar6 = PeekMatchExpr(this);
          if (bVar6) {
            piVar2 = &loc.field_1.field_0.last_column;
            loc.field_1._8_8_ = 0;
            sStack_a0 = 0;
            local_98 = 0;
            RVar8 = ParseExpr(this,(ExprList *)piVar2);
            uVar12 = loc.field_1._8_8_;
            if (RVar8.enum_ != Error) {
              local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)piVar2;
              intrusive_list<wabt::Expr>::splice
                        (exprs,(int)exprs,(__off64_t *)0x0,(int)piVar2,(__off64_t *)piVar2,
                         loc.field_1._8_8_,(int)piVar2);
              uVar12 = loc.field_1._8_8_;
            }
            while ((long *)uVar12 != (long *)0x0) {
              plVar4 = *(long **)(uVar12 + 8);
              (**(code **)(*(long *)uVar12 + 8))();
              uVar12 = plVar4;
            }
            if (RVar8.enum_ == Error) goto LAB_00f5899d;
          }
          bVar6 = MatchLpar(this,Then);
          if (bVar6) {
            RVar8 = ParseTerminatingInstrList(this,&(local_38->true_).exprs);
            if (RVar8.enum_ != Error) {
              GetLocation((Location *)((long)&loc.field_1 + 8),this);
              (local_38->true_).end_loc.field_1.field_1.offset = local_98;
              *(size_t *)((long)&(local_38->true_).end_loc.field_1 + 8) = aStack_90.offset;
              (local_38->true_).end_loc.filename.data_ = (char *)loc.field_1._8_8_;
              (local_38->true_).end_loc.filename.size_ = sStack_a0;
              RVar8 = Expect(this,Rpar);
              if (RVar8.enum_ != Error) {
                bVar6 = MatchLpar(this,Else);
                if (!bVar6) {
                  bVar6 = PeekMatchExpr(this);
                  if (bVar6) {
                    RVar8 = ParseExpr(this,&local_38->false_);
                    goto LAB_00f589c6;
                  }
LAB_00f589cb:
                  GetLocation((Location *)((long)&loc.field_1 + 8),this);
LAB_00f589da:
                  (local_38->false_end_loc).field_1.field_1.offset = local_98;
                  *(size_t *)((long)&(local_38->false_end_loc).field_1 + 8) = aStack_90.offset;
                  (local_38->false_end_loc).filename.data_ = (char *)loc.field_1._8_8_;
                  (local_38->false_end_loc).filename.size_ = sStack_a0;
                  pIVar11 = local_38;
LAB_00f589fa:
                  local_38 = (IfExceptExpr *)0x0;
                  local_d8._M_head_impl = (Expr *)pIVar11;
                  intrusive_list<wabt::Expr>::push_back
                            (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                   &local_d8);
                  if ((IfExceptExpr *)local_d8._M_head_impl != (IfExceptExpr *)0x0) {
                    (*(((ExprMixin<(wabt::ExprType)20> *)&(local_d8._M_head_impl)->_vptr_Expr)->
                      super_Expr)._vptr_Expr[1])();
                  }
                  local_d8._M_head_impl = (Expr *)0x0;
                  goto LAB_00f58ac4;
                }
                RVar8 = ParseTerminatingInstrList(this,&local_38->false_);
                if (RVar8.enum_ != Error) {
                  RVar8 = Expect(this,Rpar);
LAB_00f589c6:
                  if (RVar8.enum_ != Error) goto LAB_00f589cb;
                }
              }
            }
          }
          else {
            bVar6 = PeekMatchExpr(this);
            if (bVar6) {
              RVar8 = ParseExpr(this,&(local_38->true_).exprs);
              if (RVar8.enum_ != Error) {
                GetLocation((Location *)((long)&loc.field_1 + 8),this);
                (local_38->true_).end_loc.field_1.field_1.offset = local_98;
                *(size_t *)((long)&(local_38->true_).end_loc.field_1 + 8) = aStack_90.offset;
                (local_38->true_).end_loc.filename.data_ = (char *)loc.field_1._8_8_;
                (local_38->true_).end_loc.filename.size_ = sStack_a0;
                bVar6 = PeekMatchExpr(this);
                pIVar11 = local_38;
                if (!bVar6) goto LAB_00f589fa;
                RVar8 = ParseExpr(this,&local_38->false_);
                if (RVar8.enum_ != Error) {
                  GetLocation((Location *)((long)&loc.field_1 + 8),this);
                  goto LAB_00f589da;
                }
              }
              goto LAB_00f5899d;
            }
            Match(this,Lpar);
            loc.field_1._8_8_ = &stack0xffffffffffffff68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)((long)&loc.field_1 + 8),"then block","");
            __l_00._M_len = 1;
            __l_00._M_array = (iterator)((long)&loc.field_1 + 8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_58,__l_00,&local_39);
            RVar9 = ErrorExpected(this,&local_58,"(then ...)");
LAB_00f58980:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_58);
            if ((size_type *)loc.field_1._8_8_ != &stack0xffffffffffffff68) {
              operator_delete((void *)loc.field_1._8_8_);
            }
          }
        }
LAB_00f5899d:
        bVar6 = false;
        pIVar11 = local_38;
        goto LAB_00f58056;
      }
      Consume(&local_370,this);
      Token::~Token(&local_370);
      Consume(&local_320,this);
      Token::~Token(&local_320);
      MakeUnique<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Location&>
                ((wabt *)(loc.field_1.field2 + 8),(Location *)auStack_c8);
      RVar9 = ParseLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
      if ((RVar9.enum_ == Error) ||
         (RVar9 = ParseBlock(this,(Block *)(loc.field_1._8_8_ + 0x40)), uVar12 = loc.field_1._8_8_,
         RVar9.enum_ == Error)) {
LAB_00f5872b:
        bVar6 = false;
        uVar12 = loc.field_1._8_8_;
      }
      else {
        loc.field_1._8_8_ = 0;
        local_f0._M_head_impl = (Expr *)uVar12;
        intrusive_list<wabt::Expr>::push_back
                  (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_f0);
        if (local_f0._M_head_impl != (Expr *)0x0) {
          (*(local_f0._M_head_impl)->_vptr_Expr[1])();
        }
        local_f0._M_head_impl = (Expr *)0x0;
LAB_00f58770:
        bVar6 = true;
        uVar12 = loc.field_1._8_8_;
      }
    }
    else {
      if (TVar7 == If) {
        Consume(&local_230,this);
        Token::~Token(&local_230);
        Consume(&local_1e0,this);
        Token::~Token(&local_1e0);
        MakeUnique<wabt::IfExpr,wabt::Location&>((wabt *)&local_38,(Location *)auStack_c8);
        RVar8 = ParseLabelOpt(this,&(local_38->true_).label);
        RVar9.enum_ = Error;
        if ((RVar8.enum_ != Error) &&
           (RVar8 = ParseBlockDeclaration(this,&(local_38->true_).decl), RVar8.enum_ != Error)) {
          bVar6 = PeekMatchExpr(this);
          if (bVar6) {
            piVar2 = &loc.field_1.field_0.last_column;
            loc.field_1._8_8_ = 0;
            sStack_a0 = 0;
            local_98 = 0;
            RVar8 = ParseExpr(this,(ExprList *)piVar2);
            uVar12 = loc.field_1._8_8_;
            if (RVar8.enum_ != Error) {
              local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)piVar2;
              intrusive_list<wabt::Expr>::splice
                        (exprs,(int)exprs,(__off64_t *)0x0,(int)piVar2,(__off64_t *)piVar2,
                         loc.field_1._8_8_,(int)piVar2);
              uVar12 = loc.field_1._8_8_;
            }
            while ((long *)uVar12 != (long *)0x0) {
              plVar4 = *(long **)(uVar12 + 8);
              (**(code **)(*(long *)uVar12 + 8))();
              uVar12 = plVar4;
            }
            if (RVar8.enum_ == Error) goto LAB_00f5899d;
          }
          bVar6 = MatchLpar(this,Then);
          if (bVar6) {
            RVar8 = ParseTerminatingInstrList(this,&(local_38->true_).exprs);
            if (RVar8.enum_ != Error) {
              GetLocation((Location *)((long)&loc.field_1 + 8),this);
              (local_38->true_).end_loc.field_1.field_1.offset = local_98;
              *(size_t *)((long)&(local_38->true_).end_loc.field_1 + 8) = aStack_90.offset;
              (local_38->true_).end_loc.filename.data_ = (char *)loc.field_1._8_8_;
              (local_38->true_).end_loc.filename.size_ = sStack_a0;
              RVar8 = Expect(this,Rpar);
              if (RVar8.enum_ != Error) {
                bVar6 = MatchLpar(this,Else);
                if (!bVar6) {
                  bVar6 = PeekMatchExpr(this);
                  if (bVar6) {
                    RVar8 = ParseExpr(this,&local_38->false_);
                    goto LAB_00f58a54;
                  }
LAB_00f58a5d:
                  GetLocation((Location *)((long)&loc.field_1 + 8),this);
LAB_00f58a6c:
                  (local_38->false_end_loc).field_1.field_1.offset = local_98;
                  *(size_t *)((long)&(local_38->false_end_loc).field_1 + 8) = aStack_90.offset;
                  (local_38->false_end_loc).filename.data_ = (char *)loc.field_1._8_8_;
                  (local_38->false_end_loc).filename.size_ = sStack_a0;
                  pIVar11 = local_38;
LAB_00f58a8c:
                  local_38 = (IfExceptExpr *)0x0;
                  local_e0._M_head_impl = (Expr *)pIVar11;
                  intrusive_list<wabt::Expr>::push_back
                            (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                   &local_e0);
                  if ((IfExceptExpr *)local_e0._M_head_impl != (IfExceptExpr *)0x0) {
                    (*(((ExprMixin<(wabt::ExprType)20> *)&(local_e0._M_head_impl)->_vptr_Expr)->
                      super_Expr)._vptr_Expr[1])();
                  }
                  local_e0._M_head_impl = (Expr *)0x0;
LAB_00f58ac4:
                  RVar9.enum_ = Error;
                  bVar6 = true;
                  pIVar11 = local_38;
                  goto LAB_00f58056;
                }
                RVar8 = ParseTerminatingInstrList(this,&local_38->false_);
                if (RVar8.enum_ != Error) {
                  RVar8 = Expect(this,Rpar);
LAB_00f58a54:
                  if (RVar8.enum_ != Error) goto LAB_00f58a5d;
                }
              }
            }
          }
          else {
            bVar6 = PeekMatchExpr(this);
            if (!bVar6) {
              Match(this,Lpar);
              loc.field_1._8_8_ = &stack0xffffffffffffff68;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)((long)&loc.field_1 + 8),"then block","");
              __l_01._M_len = 1;
              __l_01._M_array = (iterator)((long)&loc.field_1 + 8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_58,__l_01,&local_39);
              RVar9 = ErrorExpected(this,&local_58,"(then ...)");
              goto LAB_00f58980;
            }
            RVar8 = ParseExpr(this,&(local_38->true_).exprs);
            if (RVar8.enum_ != Error) {
              GetLocation((Location *)((long)&loc.field_1 + 8),this);
              (local_38->true_).end_loc.field_1.field_1.offset = local_98;
              *(size_t *)((long)&(local_38->true_).end_loc.field_1 + 8) = aStack_90.offset;
              (local_38->true_).end_loc.filename.data_ = (char *)loc.field_1._8_8_;
              (local_38->true_).end_loc.filename.size_ = sStack_a0;
              bVar6 = PeekMatchExpr(this);
              pIVar11 = local_38;
              if (!bVar6) goto LAB_00f58a8c;
              RVar8 = ParseExpr(this,&local_38->false_);
              if (RVar8.enum_ != Error) {
                GetLocation((Location *)((long)&loc.field_1 + 8),this);
                goto LAB_00f58a6c;
              }
            }
          }
        }
        goto LAB_00f5899d;
      }
      if (TVar7 == Loop) {
        Consume(&local_2d0,this);
        Token::~Token(&local_2d0);
        Consume(&local_280,this);
        Token::~Token(&local_280);
        MakeUnique<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Location&>
                  ((wabt *)(loc.field_1.field2 + 8),(Location *)auStack_c8);
        RVar9 = ParseLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
        if ((RVar9.enum_ == Error) ||
           (RVar9 = ParseBlock(this,(Block *)(loc.field_1._8_8_ + 0x40)), uVar12 = loc.field_1._8_8_
           , RVar9.enum_ == Error)) goto LAB_00f5872b;
        loc.field_1._8_8_ = 0;
        local_e8._M_head_impl = (Expr *)uVar12;
        intrusive_list<wabt::Expr>::push_back
                  (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_e8);
        if (local_e8._M_head_impl != (Expr *)0x0) {
          (*(local_e8._M_head_impl)->_vptr_Expr[1])();
        }
        local_e8._M_head_impl = (Expr *)0x0;
        goto LAB_00f58770;
      }
      if (TVar7 != Try) goto LAB_00f58b2d;
      Consume(&local_140,this);
      Token::~Token(&local_140);
      pTVar1 = (Token *)((long)&loc.field_1 + 8);
      Consume(pTVar1,this);
      ErrorUnlessOpcodeEnabled(this,pTVar1);
      Token::~Token((Token *)((long)&loc.field_1 + 8));
      MakeUnique<wabt::TryExpr,wabt::Location&>((wabt *)&local_58,(Location *)auStack_c8);
      RVar9 = ParseLabelOpt(this,(string *)
                                 ((long)local_58.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 0x40));
      if (((RVar9.enum_ != Error) &&
          (RVar9 = ParseBlockDeclaration
                             (this,&((Block *)
                                    ((long)local_58.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 0x40))->decl)
          , RVar9.enum_ != Error)) &&
         (RVar9 = ParseInstrList(this,&((Block *)
                                       ((long)local_58.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 0x40))->
                                       exprs), RVar9.enum_ != Error)) {
        GetLocation((Location *)((long)&loc.field_1 + 8),this);
        (((Block *)
         ((long)local_58.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 0x40))->end_loc).field_1.field_1.offset
             = local_98;
        *(size_t *)
         ((long)&(((Block *)
                  ((long)local_58.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0x40))->end_loc).field_1 + 8) =
             aStack_90.offset;
        (((Block *)
         ((long)local_58.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 0x40))->end_loc).filename.data_ =
             (char *)loc.field_1._8_8_;
        (((Block *)
         ((long)local_58.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 0x40))->end_loc).filename.size_ =
             sStack_a0;
        RVar9 = Expect(this,Lpar);
        if (((RVar9.enum_ != Error) && (RVar9 = Expect(this,Catch), RVar9.enum_ != Error)) &&
           ((RVar9 = ParseTerminatingInstrList
                               (this,(ExprList *)
                                     ((long)local_58.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 0x118)),
            RVar9.enum_ != Error &&
            (RVar9 = Expect(this,Rpar),
            pbVar5 = local_58.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, RVar9.enum_ != Error)))) {
          local_58.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_d0._M_head_impl = (Expr *)pbVar5;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_d0);
          if ((IfExceptExpr *)local_d0._M_head_impl != (IfExceptExpr *)0x0) {
            (*(((ExprMixin<(wabt::ExprType)20> *)&(local_d0._M_head_impl)->_vptr_Expr)->super_Expr).
              _vptr_Expr[1])();
          }
          local_d0._M_head_impl = (Expr *)0x0;
          bVar6 = true;
          uVar12 = local_58.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00f5877a;
        }
      }
      bVar6 = false;
      uVar12 = local_58.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
LAB_00f5877a:
    if ((IfExceptExpr *)uVar12 != (IfExceptExpr *)0x0) {
      (*(((IfExceptExpr *)uVar12)->super_ExprMixin<(wabt::ExprType)20>).super_Expr._vptr_Expr[1])();
    }
    RVar9.enum_ = Error;
    goto LAB_00f58061;
  }
  Consume(&local_3c0,this);
  Token::~Token(&local_3c0);
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  RVar8 = ParsePlainInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_58
                         );
  if ((RVar8.enum_ == Error) || (RVar8 = ParseExprList(this,exprs), RVar8.enum_ == Error)) {
LAB_00f5804f:
    bVar6 = false;
    pIVar11 = (IfExceptExpr *)
              local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    loc.field_1._8_8_ = &stack0xffffffffffffff68;
    std::__cxx11::string::_M_construct<char_const*>((string *)((long)&loc.field_1 + 8),"an expr","")
    ;
    __l._M_len = 1;
    __l._M_array = (iterator)((long)&loc.field_1 + 8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)auStack_c8,__l,(allocator_type *)&local_38);
    RVar8 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)auStack_c8,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_c8);
    if ((size_type *)loc.field_1._8_8_ != &stack0xffffffffffffff68) {
      operator_delete((void *)loc.field_1._8_8_);
    }
    pbVar5 = local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (RVar8.enum_ == Error) goto LAB_00f5804f;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if (((((ExprMixin<(wabt::ExprType)20> *)&pbVar5->_M_dataplus)->super_Expr).
         super_intrusive_list_base<wabt::Expr>.prev_ != (Expr *)0x0) ||
       ((((ExprMixin<(wabt::ExprType)20> *)&pbVar5->_M_dataplus)->super_Expr).
        super_intrusive_list_base<wabt::Expr>.next_ != (Expr *)0x0)) {
      __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/intrusive-list.h"
                    ,0x1bf,
                    "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
                   );
    }
    pEVar3 = exprs->last_;
    pEVar10 = exprs;
    if (pEVar3 != (Expr *)0x0) {
      (((ExprMixin<(wabt::ExprType)20> *)&pbVar5->_M_dataplus)->super_Expr).
      super_intrusive_list_base<wabt::Expr>.prev_ = pEVar3;
      pEVar10 = (ExprList *)&pEVar3->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar10->first_ = (Expr *)pbVar5;
    exprs->last_ = (Expr *)pbVar5;
    exprs->size_ = exprs->size_ + 1;
    bVar6 = true;
    pIVar11 = (IfExceptExpr *)
              local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
LAB_00f58056:
  if (pIVar11 != (IfExceptExpr *)0x0) {
    (*(pIVar11->super_ExprMixin<(wabt::ExprType)20>).super_Expr._vptr_Expr[1])();
  }
LAB_00f58061:
  if (bVar6) {
    RVar9 = Expect(this,Rpar);
    RVar9.enum_ = (Enum)(RVar9.enum_ == Error);
  }
  return (Result)RVar9.enum_;
}

Assistant:

Result WastParser::ParseExpr(ExprList* exprs) {
  WABT_TRACE(ParseExpr);
  if (!PeekMatch(TokenType::Lpar)) {
    return Result::Error;
  }

  if (IsPlainInstr(Peek(1))) {
    Consume();
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    CHECK_RESULT(ParseExprList(exprs));
    CHECK_RESULT(ErrorIfLpar({"an expr"}));
    exprs->push_back(std::move(expr));
  } else {
    Location loc = GetLocation();

    switch (Peek(1)) {
      case TokenType::Block: {
        Consume();
        Consume();
        auto expr = MakeUnique<BlockExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Loop: {
        Consume();
        Consume();
        auto expr = MakeUnique<LoopExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::If: {
        Consume();
        Consume();
        auto expr = MakeUnique<IfExpr>(loc);

        CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));

        if (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        if (MatchLpar(TokenType::Then)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          EXPECT(Rpar);

          if (MatchLpar(TokenType::Else)) {
            CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
            EXPECT(Rpar);
          } else if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
          }
          expr->false_end_loc = GetLocation();
        } else if (PeekMatchExpr()) {
          CHECK_RESULT(ParseExpr(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
            expr->false_end_loc = GetLocation();
          }
        } else {
          ConsumeIfLpar();
          return ErrorExpected({"then block"}, "(then ...)");
        }

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::IfExcept: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());
        auto expr = MakeUnique<IfExceptExpr>(loc);

        CHECK_RESULT(ParseIfExceptHeader(expr.get()));

        if (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        if (MatchLpar(TokenType::Then)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          EXPECT(Rpar);

          if (MatchLpar(TokenType::Else)) {
            CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
            EXPECT(Rpar);
          } else if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
          }
          expr->false_end_loc = GetLocation();
        } else if (PeekMatchExpr()) {
          CHECK_RESULT(ParseExpr(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
            expr->false_end_loc = GetLocation();
          }
        } else {
          ConsumeIfLpar();
          return ErrorExpected({"then block"}, "(then ...)");
        }

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Try: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());

        auto expr = MakeUnique<TryExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        expr->block.end_loc = GetLocation();
        EXPECT(Lpar);
        EXPECT(Catch);
        CHECK_RESULT(ParseTerminatingInstrList(&expr->catch_));
        EXPECT(Rpar);
        exprs->push_back(std::move(expr));
        break;
      }

      default:
        assert(!"ParseExpr should only be called when IsExpr() is true");
        return Result::Error;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}